

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Im<(moira::Mode)11,_2> wrapper)

{
  Syntax SVar1;
  Imu<2> local_28;
  Ims<2> local_24;
  Ea<(moira::Mode)11,_2> *local_20;
  Ea<(moira::Mode)11,_2> *ea;
  StrWriter *this_local;
  Im<(moira::Mode)11,_2> wrapper_local;
  
  SVar1 = this->style->syntax;
  local_20 = wrapper.ea;
  ea = (Ea<(moira::Mode)11,_2> *)this;
  this_local = (StrWriter *)wrapper.ea;
  if (SVar1 == GNU || SVar1 == GNU_MIT) {
    Ims<2>::Ims(&local_24,(wrapper.ea)->ext1);
    operator<<(this,local_24);
  }
  else {
    Imu<2>::Imu(&local_28,(wrapper.ea)->ext1);
    operator<<(this,local_28);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Im<M, S> wrapper)
{
    auto &ea = wrapper.ea;

    switch (style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            *this << Ims<S>(ea.ext1);
            break;

        default:

            *this << Imu<S>(ea.ext1);
            break;
    }

    return *this;
}